

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

LClosure * luaY_parser(lua_State *L,ZIO *z,Mbuffer *buff,Dyndata *dyd,char *name,int firstchar)

{
  StkId pSVar1;
  LClosure *o;
  Table *pTVar2;
  TString *pTVar3;
  Table *x__1;
  TValue *io_1;
  LClosure *x_;
  TValue *io;
  LClosure *cl;
  FuncState funcstate;
  LexState lexstate;
  int firstchar_local;
  char *name_local;
  Dyndata *dyd_local;
  Mbuffer *buff_local;
  ZIO *z_local;
  lua_State *L_local;
  
  o = luaF_newLclosure(L,1);
  pSVar1 = (L->top).p;
  *(LClosure **)pSVar1 = o;
  (pSVar1->val).tt_ = 'F';
  luaD_inctop(L);
  pTVar2 = luaH_new(L);
  pSVar1 = (L->top).p;
  (pSVar1->val).value_.gc = (GCObject *)pTVar2;
  (pSVar1->val).tt_ = 'E';
  luaD_inctop(L);
  cl = (LClosure *)luaF_newproto(L);
  o->p = (Proto *)cl;
  if (((o->marked & 0x20) != 0) && ((o->p->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)o,(GCObject *)o->p);
  }
  pTVar3 = luaS_new(L,name);
  cl[2].upvals[0] = (UpVal *)pTVar3;
  if (((cl->marked & 0x20) != 0) && ((cl[2].upvals[0]->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)cl,(GCObject *)cl[2].upvals[0]);
  }
  (dyd->label).n = 0;
  (dyd->gt).n = 0;
  (dyd->actvar).n = 0;
  luaX_setinput(L,(LexState *)&funcstate.ndebugvars,z,(TString *)cl[2].upvals[0],firstchar);
  mainfunc((LexState *)&funcstate.ndebugvars,(FuncState *)&cl);
  (L->top).p = (StkId)((L->top).offset + -0x10);
  return o;
}

Assistant:

LClosure *luaY_parser (lua_State *L, ZIO *z, Mbuffer *buff,
                       Dyndata *dyd, const char *name, int firstchar) {
  LexState lexstate;
  FuncState funcstate;
  LClosure *cl = luaF_newLclosure(L, 1);  /* create main closure */
  setclLvalue2s(L, L->top.p, cl);  /* anchor it (to avoid being collected) */
  luaD_inctop(L);
  lexstate.h = luaH_new(L);  /* create table for scanner */
  sethvalue2s(L, L->top.p, lexstate.h);  /* anchor it */
  luaD_inctop(L);
  funcstate.f = cl->p = luaF_newproto(L);
  luaC_objbarrier(L, cl, cl->p);
  funcstate.f->source = luaS_new(L, name);  /* create and anchor TString */
  luaC_objbarrier(L, funcstate.f, funcstate.f->source);
  lexstate.buff = buff;
  lexstate.dyd = dyd;
  dyd->actvar.n = dyd->gt.n = dyd->label.n = 0;
  luaX_setinput(L, &lexstate, z, funcstate.f->source, firstchar);
  mainfunc(&lexstate, &funcstate);
  lua_assert(!funcstate.prev && funcstate.nups == 1 && !lexstate.fs);
  /* all scopes should be correctly finished */
  lua_assert(dyd->actvar.n == 0 && dyd->gt.n == 0 && dyd->label.n == 0);
  L->top.p--;  /* remove scanner's table */
  return cl;  /* closure is on the stack, too */
}